

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int fs_read(char *name,void **result,uint *result_len)

{
  FILE *__stream;
  
  __stream = fopen(name,"rb");
  *result = (void *)0x0;
  *result_len = 0;
  if (__stream != (FILE *)0x0) {
    io_read_all((IOHANDLE)__stream,result,result_len);
    fclose(__stream);
  }
  return (uint)(__stream == (FILE *)0x0);
}

Assistant:

int fs_read(const char *name, void **result, unsigned *result_len)
{
	IOHANDLE file = io_open(name, IOFLAG_READ);
	*result = 0;
	*result_len = 0;
	if(!file)
	{
		return 1;
	}
	io_read_all(file, result, result_len);
	io_close(file);
	return 0;
}